

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void __thiscall
capnp::DynamicList::Builder::adopt(Builder *this,uint index,Orphan<capnp::DynamicValue> *orphan)

{
  StructBuilder other;
  bool bVar1;
  Which WVar2;
  uint uVar3;
  StructSchema SVar4;
  InterfaceSchema other_00;
  ushort uVar5;
  Fault f;
  ListSchema elementType;
  Reader local_c8;
  StructBuilder local_78;
  Schema local_50;
  StructBuilder local_48;
  
  WVar2 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar2 = (this->schema).elementType.baseType;
  }
  if (WVar2 < TEXT) {
switchD_001a3d64_caseD_f:
    Orphan<capnp::DynamicValue>::getReader(&local_c8,orphan);
    set(this,index,&local_c8);
    if ((local_c8.type == CAPABILITY) && (local_c8.field_1._8_8_ != (SegmentReader *)0x0)) {
      (*(code *)(local_c8.field_1.anyPointerValue.reader.segment)->arena->_vptr_Arena)
                (local_c8.field_1.intValue,
                 (long)&(local_c8.field_1.structValue.reader.segment)->arena +
                 (long)(local_c8.field_1.structValue.reader.segment)->arena[-2]._vptr_Arena);
    }
  }
  else {
    switch(WVar2) {
    case TEXT:
      if (orphan->type != TEXT) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x529,FAILED,"orphan.getType() == DynamicValue::TEXT","\"Value type mismatch.\""
                   ,(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c8);
      }
      break;
    case DATA:
      if (orphan->type != DATA) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x52e,FAILED,"orphan.getType() == DynamicValue::DATA","\"Value type mismatch.\""
                   ,(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c8);
      }
      break;
    case LIST:
      local_78._0_16_ = Type::asList((Type *)this);
      if ((orphan->type != LIST) ||
         (bVar1 = Type::operator==((Type *)&(orphan->field_1).enumValue,(Type *)&local_78), !bVar1))
      {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x535,FAILED,
                   "orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType",
                   "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c8);
      }
      break;
    case ENUM:
      goto switchD_001a3d64_caseD_f;
    case STRUCT:
      SVar4 = Type::asStruct((Type *)this);
      if ((orphan->type == STRUCT) &&
         ((RawBrandedSchema *)(orphan->field_1).intValue == SVar4.super_Schema.raw)) {
        _::ListBuilder::getStructElement(&local_78,&this->builder,index);
        local_50 = SVar4.super_Schema.raw;
        Schema::getProto((Reader *)&local_c8,&local_50);
        uVar3 = 0;
        if (local_c8.field_1._24_4_ < 0x80) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)(local_c8.field_1.textValue.super_StringPtr.content.size_ + 0xe);
          if (0xcf < local_c8.field_1._24_4_) {
            uVar3 = (uint)(ushort)((local_c8.field_1.structValue.reader.segment)->ptr).size_ << 0x10
            ;
          }
        }
        _::OrphanBuilder::asStruct(&local_48,&orphan->builder,(StructSize)(uVar5 | uVar3));
        other.capTable = local_48.capTable;
        other.segment = local_48.segment;
        other.data = local_48.data;
        other.pointers = local_48.pointers;
        other.dataSize = local_48.dataSize;
        other.pointerCount = local_48.pointerCount;
        other._38_2_ = local_48._38_2_;
        _::StructBuilder::transferContentFrom(&local_78,other);
        return;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                ((Fault *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x53d,FAILED,
                 "orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType",
                 "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&local_c8);
    case INTERFACE:
      other_00 = Type::asInterface((Type *)this);
      if ((orphan->type != CAPABILITY) ||
         (bVar1 = InterfaceSchema::extends(&(orphan->field_1).interfaceSchema,other_00), !bVar1)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  ((Fault *)&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x54a,FAILED,
                   "orphan.getType() == DynamicValue::CAPABILITY && orphan.interfaceSchema.extends(elementType)"
                   ,"\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::fatal((Fault *)&local_c8);
      }
      break;
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x544,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal((Fault *)&local_c8);
    default:
      kj::_::unreachable();
    }
    local_c8.field_1.structValue.reader.segment =
         (SegmentReader *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    local_c8._0_8_ = (this->builder).segment;
    local_c8.field_1.intValue = (int64_t)(this->builder).capTable;
    _::PointerBuilder::adopt((PointerBuilder *)&local_c8,&orphan->builder);
  }
  return;
}

Assistant:

void DynamicList::Builder::adopt(uint index, Orphan<DynamicValue>&& orphan) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
      set(index, orphan.getReader());
      return;

    case schema::Type::TEXT:
      KJ_REQUIRE(orphan.getType() == DynamicValue::TEXT, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::DATA:
      KJ_REQUIRE(orphan.getType() == DynamicValue::DATA, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType,
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }

    case schema::Type::STRUCT: {
      auto elementType = schema.getStructElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType,
                 "Value type mismatch.");
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(structSizeFromSchema(elementType)));
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");

    case schema::Type::INTERFACE: {
      auto elementType = schema.getInterfaceElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::CAPABILITY &&
                 orphan.interfaceSchema.extends(elementType),
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }
  }

  KJ_UNREACHABLE;
}